

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,
                mrg_parameter<int,_3,_trng::mrg3s> *P)

{
  undefined4 uVar1;
  long lVar2;
  mrg_parameter<int,_3,_trng::mrg3s> P_new;
  delim_c local_3b;
  delim_c local_3a;
  delim_c local_39;
  undefined8 local_38;
  int local_30;
  
  local_30 = 0;
  local_38 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_39.c = '(';
  utility::operator>>(in,&local_39);
  lVar2 = 0;
  do {
    std::istream::operator>>((istream *)in,(int *)((long)&local_38 + lVar2));
    if (lVar2 == 8) break;
    local_3b.c = ' ';
    utility::operator>>(in,&local_3b);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  local_3a.c = ')';
  utility::operator>>(in,&local_3a);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    P->a[2] = local_30;
    *(undefined8 *)P->a = local_38;
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_parameter &P) {
      mrg_parameter P_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> P_new.a[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        P = P_new;
      in.flags(flags);
      return in;
    }